

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O3

int * Gia_PermuteSpecialOrder(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *pCosts;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  
  Gia_ManCreateRefs(p);
  iVar1 = p->nRegs;
  pVVar7 = p->vCis;
  uVar2 = pVVar7->nSize;
  uVar5 = (ulong)uVar2;
  iVar6 = uVar2 - iVar1;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar3 = iVar6;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    pCosts = (int *)0x0;
  }
  else {
    pCosts = (int *)malloc((long)iVar3 << 2);
  }
  iVar3 = 0;
  p_00->pArray = pCosts;
  if (iVar1 < (int)uVar2) {
    lVar8 = 0;
    do {
      if ((int)uVar5 <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar7->pArray[lVar8];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,p->pRefs[iVar1]);
      lVar8 = lVar8 + 1;
      pVVar7 = p->vCis;
      uVar5 = (ulong)pVVar7->nSize;
    } while (lVar8 < (long)(uVar5 - (long)p->nRegs));
    pCosts = p_00->pArray;
    iVar3 = p_00->nSize;
  }
  piVar4 = Abc_QuickSortCost(pCosts,iVar3,1);
  if (pCosts != (int *)0x0) {
    free(pCosts);
  }
  free(p_00);
  return piVar4;
}

Assistant:

int * Gia_PermuteSpecialOrder( Gia_Man_t * p )
{
    Vec_Int_t * vPerm;
    Gia_Obj_t * pObj;
    int i, * pOrder;
    Gia_ManCreateRefs( p );
    vPerm = Vec_IntAlloc( Gia_ManPiNum(p) );
    Gia_ManForEachPi( p, pObj, i )
        Vec_IntPush( vPerm, Gia_ObjRefNum(p, pObj) );
    pOrder = Abc_QuickSortCost( Vec_IntArray(vPerm), Vec_IntSize(vPerm), 1 );
    Vec_IntFree( vPerm );
    return pOrder;
}